

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O0

void addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetworkClassifier>
               (Model *m,NeuralNetworkClassifier *nn,char *lossName,char *softmaxInputName,
               char *targetName)

{
  NetworkUpdateParameters *this;
  LossLayer *this_00;
  CategoricalCrossEntropyLossLayer *this_01;
  ModelDescription *this_02;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this_03;
  FeatureDescription *this_04;
  string *value;
  FeatureType *this_05;
  ArrayFeatureType *this_06;
  ArrayFeatureType *trainingInputTensorShape;
  FeatureDescription *trainingInput;
  CategoricalCrossEntropyLossLayer *ceLossLayer;
  LossLayer *lossLayer;
  NetworkUpdateParameters *updateParams;
  char *targetName_local;
  char *softmaxInputName_local;
  char *lossName_local;
  NeuralNetworkClassifier *nn_local;
  Model *m_local;
  
  this = CoreML::Specification::NeuralNetworkClassifier::mutable_updateparams(nn);
  this_00 = CoreML::Specification::NetworkUpdateParameters::add_losslayers(this);
  CoreML::Specification::LossLayer::set_name(this_00,lossName);
  this_01 = CoreML::Specification::LossLayer::mutable_categoricalcrossentropylosslayer(this_00);
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_input(this_01,softmaxInputName);
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_target(this_01,targetName);
  this_02 = CoreML::Specification::Model::mutable_description(m);
  this_03 = CoreML::Specification::ModelDescription::mutable_traininginput(this_02);
  this_04 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                      (this_03);
  value = CoreML::Specification::CategoricalCrossEntropyLossLayer::target_abi_cxx11_(this_01);
  CoreML::Specification::FeatureDescription::set_name(this_04,value);
  this_05 = CoreML::Specification::FeatureDescription::mutable_type(this_04);
  this_06 = CoreML::Specification::FeatureType::mutable_multiarraytype(this_05);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (this_06,ArrayFeatureType_ArrayDataType_INT32);
  CoreML::Specification::ArrayFeatureType::add_shape(this_06,1);
  return;
}

Assistant:

void addCategoricalCrossEntropyLoss(Specification::Model& m, NeuralNetworkClass *nn, const char *lossName, const char *softmaxInputName, const char *targetName) {

    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name(lossName);
    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input(softmaxInputName);
    ceLossLayer->set_target(targetName);

    auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(ceLossLayer->target());
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

}